

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_base.cpp
# Opt level: O0

ssize_t __thiscall ximu::ReaderBase::read(ReaderBase *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  ReadResult RVar2;
  size_type sVar3;
  size_type extraout_RAX;
  byte local_309;
  iterator local_300;
  _Self local_2e0;
  const_iterator local_2c0;
  iterator local_2a0;
  const_iterator local_280;
  iterator local_260;
  _Self local_240;
  const_iterator local_220;
  iterator local_200;
  const_iterator local_1e0;
  _Self local_1c0;
  iterator local_1a0;
  iterator local_180;
  _Self local_160;
  const_iterator local_140;
  iterator local_120;
  const_iterator local_100;
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> local_e0;
  iterator local_c0;
  ulong local_a0;
  size_t msgLength;
  iterator local_78;
  iterator local_58;
  undefined1 local_38 [8];
  _Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> frameBuffer;
  bool done;
  ReaderBase *this_local;
  
  frameBuffer._M_node._7_1_ = 0;
  while( true ) {
    sVar3 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_buffer);
    local_309 = 0;
    if (4 < sVar3) {
      local_309 = frameBuffer._M_node._7_1_ ^ 0xff;
    }
    if ((local_309 & 1) == 0) break;
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::begin(&local_58,&this->_buffer);
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::end(&local_78,&this->_buffer);
    std::
    find_if<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>,bool(*)(unsigned_char)>
              ((_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *)local_38,
               &local_58,&local_78,isFrameBuffer);
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((iterator *)&msgLength,&this->_buffer);
    bVar1 = std::operator==((_Self *)local_38,(_Self *)&msgLength);
    if (bVar1) {
      sVar3 = std::deque<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->_buffer);
      if (0x1e < sVar3) {
        std::deque<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->_buffer);
        sVar3 = extraout_RAX;
      }
      return sVar3;
    }
    std::deque<unsigned_char,_std::allocator<unsigned_char>_>::begin(&local_c0,&this->_buffer);
    std::_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*>::_Deque_iterator
              (&local_e0,
               (_Deque_iterator<unsigned_char,_unsigned_char_&,_unsigned_char_*> *)local_38);
    local_a0 = std::distance<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>>
                         (&local_c0,&local_e0);
    if ((local_a0 < 4) || (0x1e < local_a0)) {
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::begin(&local_120,&this->_buffer);
      std::_Deque_iterator<unsigned_char,unsigned_char_const&,unsigned_char_const*>::
      _Deque_iterator<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>,void>
                ((_Deque_iterator<unsigned_char,unsigned_char_const&,unsigned_char_const*> *)
                 &local_100,&local_120);
      std::operator+(&local_160,(_Self *)local_38,1);
      std::_Deque_iterator<unsigned_char,unsigned_char_const&,unsigned_char_const*>::
      _Deque_iterator<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>,void>
                ((_Deque_iterator<unsigned_char,unsigned_char_const&,unsigned_char_const*> *)
                 &local_140,&local_160);
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::erase
                (&local_180,&this->_buffer,&local_100,&local_140);
    }
    else {
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::begin(&local_1a0,&this->_buffer);
      std::operator+(&local_1c0,(_Self *)local_38,1);
      RVar2 = PacketReader::read<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>>
                        (&this->super_PacketReader,&local_1a0,&local_1c0);
      if ((RVar2 == OKE) || (RVar2 == INVALID_CHECKSUM || RVar2 == INVALID_PACKET_SIZE)) {
        std::deque<unsigned_char,_std::allocator<unsigned_char>_>::begin(&local_200,&this->_buffer);
        std::_Deque_iterator<unsigned_char,unsigned_char_const&,unsigned_char_const*>::
        _Deque_iterator<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>,void>
                  ((_Deque_iterator<unsigned_char,unsigned_char_const&,unsigned_char_const*> *)
                   &local_1e0,&local_200);
        std::operator+(&local_240,(_Self *)local_38,1);
        std::_Deque_iterator<unsigned_char,unsigned_char_const&,unsigned_char_const*>::
        _Deque_iterator<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>,void>
                  ((_Deque_iterator<unsigned_char,unsigned_char_const&,unsigned_char_const*> *)
                   &local_220,&local_240);
        std::deque<unsigned_char,_std::allocator<unsigned_char>_>::erase
                  (&local_260,&this->_buffer,&local_1e0,&local_220);
      }
      else {
        std::deque<unsigned_char,_std::allocator<unsigned_char>_>::begin(&local_2a0,&this->_buffer);
        std::_Deque_iterator<unsigned_char,unsigned_char_const&,unsigned_char_const*>::
        _Deque_iterator<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>,void>
                  ((_Deque_iterator<unsigned_char,unsigned_char_const&,unsigned_char_const*> *)
                   &local_280,&local_2a0);
        std::operator+(&local_2e0,(_Self *)local_38,1);
        std::_Deque_iterator<unsigned_char,unsigned_char_const&,unsigned_char_const*>::
        _Deque_iterator<std::_Deque_iterator<unsigned_char,unsigned_char&,unsigned_char*>,void>
                  ((_Deque_iterator<unsigned_char,unsigned_char_const&,unsigned_char_const*> *)
                   &local_2c0,&local_2e0);
        std::deque<unsigned_char,_std::allocator<unsigned_char>_>::erase
                  (&local_300,&this->_buffer,&local_280,&local_2c0);
      }
    }
  }
  return (ulong)local_309;
}

Assistant:

void ReaderBase::read() {
  bool done = false;

  // todo @aukedirk no-magic numbers
  while (_buffer.size() > 4 && !done) {

      // locate potential header byte
    auto frameBuffer = std::find_if(
        _buffer.begin(), _buffer.end(), isFrameBuffer);

    // we did not find the framebuffer
    if (frameBuffer == _buffer.end())
    {
        if (_buffer.size() > 30)
            _buffer.clear();
        return;
    }

    // All messages are between 4 and 30 bytes
    size_t msgLength = std::distance(_buffer.begin(),frameBuffer);
    if (msgLength < 4 || msgLength > 30)
    {
        _buffer.erase(_buffer.begin(), frameBuffer + 1);
    }
    else
    {
        //  todo @auke-dirk investigate enum
        //  pass to the packetreader
        switch (PacketReader::read(_buffer.begin(), frameBuffer + 1)) {
          case PacketReader::INVALID_CHECKSUM:
          case PacketReader::OKE:
          case PacketReader::INVALID_PACKET_SIZE:
            _buffer.erase(_buffer.begin(), frameBuffer + 1);
            break;
          default:
            _buffer.erase(_buffer.begin(), frameBuffer + 1);
        }
    }
  }
}